

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcSpaceProgram::IfcSpaceProgram(IfcSpaceProgram *this)

{
  IfcSpaceProgram *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x148,"IfcSpaceProgram");
  IfcControl::IfcControl((IfcControl *)this,&PTR_construction_vtable_24__00fc4a20);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceProgram,_5UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceProgram,_5UL>,
             &PTR_construction_vtable_24__00fc4ad0);
  *(undefined8 *)this = 0xfc4940;
  *(undefined8 *)&this->field_0x148 = 0xfc4a08;
  *(undefined8 *)&this->field_0x88 = 0xfc4968;
  *(undefined8 *)&this->field_0x98 = 0xfc4990;
  *(undefined8 *)&this->field_0xd0 = 0xfc49b8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceProgram,_5UL>)._vptr_ObjectHelper =
       (_func_int **)0xfc49e0;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceProgram,_5UL>).field_0x10);
  STEP::Maybe<double>::Maybe(&this->MaxRequiredArea);
  STEP::Maybe<double>::Maybe(&this->MinRequiredArea);
  STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcSpatialStructureElement>_>::Maybe
            (&this->RequestedLocation);
  return;
}

Assistant:

IfcSpaceProgram() : Object("IfcSpaceProgram") {}